

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar6;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  long lVar7;
  char **ppcVar8;
  byte *pbVar9;
  byte *pbVar10;
  char **ppcVar11;
  
  if (ptr == end) {
    return -4;
  }
  lVar7 = 1;
  puVar5 = &switchD_00154cd0::switchdataD_001d73d0;
  pcVar6 = end;
  ppcVar11 = nextTokPtr;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    if (ptr + 1 == end) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
    switch(bVar1) {
    case 0xf:
      iVar3 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar3;
    case 0x10:
      iVar3 = normal_scanDecl(enc,ptr + 2,end,nextTokPtr);
      return iVar3;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      break;
    case 0x16:
    case 0x18:
switchD_00155269_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar1 - 5 < 3) || (bVar1 == 0x1d)) goto switchD_00155269_caseD_16;
    }
switchD_00155230_default:
    *nextTokPtr = ptr + 1;
    goto LAB_001552b1;
  default:
    *nextTokPtr = ptr;
    goto LAB_001552b1;
  case 4:
    pcVar6 = ptr + 1;
    if (pcVar6 == end) {
      return -0x1a;
    }
    if (*pcVar6 == ']') {
      if (ptr + 2 == end) {
        return -1;
      }
      if (ptr[2] == '>') {
        *nextTokPtr = ptr + 3;
        return 0x22;
      }
    }
    *nextTokPtr = pcVar6;
    iVar3 = 0x1a;
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
    lVar7 = 2;
    pcVar6 = extraout_RDX_05;
    if (iVar3 != 0) goto LAB_00154ceb;
    iVar4 = (*enc[2].isPublicId)(enc,ptr,extraout_RDX_05,(char **)puVar5);
    pcVar6 = extraout_RDX_06;
LAB_00155183:
    iVar3 = 0x13;
    if (iVar4 != 0) goto LAB_00154cf0;
switchD_00154d23_caseD_8:
    *nextTokPtr = ptr;
    goto LAB_001552b1;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[0])(enc,ptr,end,(char **)&switchD_00154cd0::switchdataD_001d73d0);
    lVar7 = 3;
    pcVar6 = extraout_RDX_08;
    if (iVar3 == 0) {
      iVar4 = (*enc[2].utf8Convert)
                        (enc,(char **)ptr,extraout_RDX_08,(char **)puVar5,(char *)ppcVar11);
      pcVar6 = extraout_RDX_09;
      goto LAB_00155183;
    }
    goto LAB_00154ceb;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[1])(enc,ptr,end,(char **)&switchD_00154cd0::switchdataD_001d73d0);
    lVar7 = 4;
    pcVar6 = extraout_RDX_10;
    if (iVar3 == 0) {
      iVar4 = (*enc[2].utf16Convert)
                        (enc,(char **)ptr,extraout_RDX_10,(unsigned_short **)puVar5,
                         (unsigned_short *)ppcVar11);
      pcVar6 = extraout_RDX_11;
      goto LAB_00155183;
    }
    goto LAB_00154ceb;
  case 9:
    if (ptr + 1 == end) {
      return -0xf;
    }
  case 10:
  case 0x15:
    pbVar9 = (byte *)(ptr + 1);
    pbVar10 = pbVar9;
    for (; (pbVar9 != (byte *)end &&
           (((cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar9), cVar2 == '\x15' ||
             (cVar2 == '\n')) || ((pbVar10 = pbVar9, cVar2 == '\t' && (pbVar9 + 1 != (byte *)end))))
           )); pbVar9 = pbVar9 + 1) {
      pbVar10 = (byte *)end;
    }
    *nextTokPtr = (char *)pbVar10;
    iVar3 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x11;
    break;
  case 0xc:
    iVar3 = 0xc;
    goto LAB_0015519d;
  case 0xd:
    iVar3 = 0xd;
LAB_0015519d:
    iVar3 = normal_scanLit(iVar3,enc,ptr + 1,end,nextTokPtr);
    return iVar3;
  case 0x13:
    pbVar9 = (byte *)(ptr + 1);
    if (pbVar9 == (byte *)end) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar9);
    if (bVar1 < 0x16) {
      if (bVar1 == 5) {
        if ((long)end - (long)pbVar9 < 2) {
          return -2;
        }
        iVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,pbVar9);
        lVar7 = 3;
        pcVar6 = extraout_RDX_12;
      }
      else if (bVar1 == 6) {
        if ((long)end - (long)pbVar9 < 3) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[0])
                          (enc,(char *)pbVar9,end,(char **)&switchD_00154cd0::switchdataD_001d73d0);
        lVar7 = 4;
        pcVar6 = extraout_RDX_13;
      }
      else {
        if (bVar1 != 7) goto LAB_001553e6;
        if ((long)end - (long)pbVar9 < 4) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[1])
                          (enc,(char *)pbVar9,end,(char **)&switchD_00154cd0::switchdataD_001d73d0);
        lVar7 = 5;
        pcVar6 = extraout_RDX_07;
      }
      if (iVar3 == 0) {
LAB_001553e6:
        *nextTokPtr = (char *)pbVar9;
        goto LAB_001552b1;
      }
    }
    else {
      lVar7 = 2;
      if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto LAB_001553e6;
    }
    ppcVar11 = (char **)(ptr + lVar7);
    ppcVar8 = nextTokPtr;
    while( true ) {
      if (ppcVar11 == (char **)end) {
        return -0x14;
      }
      lVar7 = 1;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar11)) {
      case 5:
        if ((long)end - (long)ppcVar11 < 2) {
          return -2;
        }
        iVar3 = (*enc[2].isPublicId)(enc,(char *)ppcVar11,pcVar6,(char **)&DAT_00000001);
        lVar7 = 2;
        pcVar6 = extraout_RDX_14;
        break;
      case 6:
        if ((long)end - (long)ppcVar11 < 3) {
          return -2;
        }
        iVar3 = (*enc[2].utf8Convert)(enc,ppcVar11,pcVar6,(char **)&DAT_00000001,(char *)ppcVar8);
        lVar7 = 3;
        pcVar6 = extraout_RDX_16;
        break;
      case 7:
        if ((long)end - (long)ppcVar11 < 4) {
          return -2;
        }
        iVar3 = (*enc[2].utf16Convert)
                          (enc,ppcVar11,pcVar6,(unsigned_short **)&DAT_00000001,
                           (unsigned_short *)ppcVar8);
        lVar7 = 4;
        pcVar6 = extraout_RDX_15;
        break;
      default:
        goto switchD_00155360_caseD_8;
      case 9:
      case 10:
      case 0xb:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x24:
        *nextTokPtr = (char *)ppcVar11;
        return 0x14;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_00155360_caseD_16;
      }
      if (iVar3 == 0) break;
switchD_00155360_caseD_16:
      ppcVar11 = (char **)((long)ppcVar11 + lVar7);
    }
switchD_00155360_caseD_8:
    *nextTokPtr = (char *)ppcVar11;
LAB_001552b1:
    iVar3 = 0;
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x19;
    break;
  case 0x16:
  case 0x18:
LAB_00154ceb:
    iVar3 = 0x12;
LAB_00154cf0:
    ppcVar8 = (char **)(ptr + lVar7);
joined_r0x00154cf6:
    ptr = (char *)ppcVar8;
    if (ptr == end) {
      return -iVar3;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 5:
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
      iVar4 = (*enc[2].isPublicId)(enc,ptr,pcVar6,(char **)puVar5);
      if (iVar4 == 0) goto switchD_00154d23_caseD_8;
      ppcVar8 = (char **)((long)ptr + 2);
      pcVar6 = extraout_RDX_00;
      goto joined_r0x00154cf6;
    case 6:
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
      iVar4 = (*enc[2].utf8Convert)(enc,(char **)ptr,pcVar6,(char **)puVar5,(char *)ppcVar11);
      if (iVar4 == 0) goto switchD_00154d23_caseD_8;
      ppcVar8 = (char **)((long)ptr + 3);
      pcVar6 = extraout_RDX_01;
      goto joined_r0x00154cf6;
    case 7:
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      iVar4 = (*enc[2].utf16Convert)
                        (enc,(char **)ptr,pcVar6,(unsigned_short **)puVar5,
                         (unsigned_short *)ppcVar11);
      if (iVar4 == 0) goto switchD_00154d23_caseD_8;
      ppcVar8 = (char **)((long)ptr + 4);
      pcVar6 = extraout_RDX;
      goto joined_r0x00154cf6;
    default:
      goto switchD_00154d23_caseD_8;
    case 9:
    case 10:
    case 0xb:
    case 0x14:
    case 0x15:
    case 0x1e:
    case 0x20:
    case 0x23:
    case 0x24:
      *nextTokPtr = ptr;
      return iVar3;
    case 0xf:
      if (iVar3 != 0x13) {
        *nextTokPtr = (char *)((long)ptr + 1);
        return 0x1e;
      }
      goto switchD_00154d23_caseD_8;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      ppcVar8 = (char **)((long)ptr + 1);
      goto joined_r0x00154cf6;
    case 0x17:
      goto switchD_00154d23_caseD_17;
    case 0x21:
      if (iVar3 != 0x13) {
        *nextTokPtr = (char *)((long)ptr + 1);
        return 0x1f;
      }
      goto switchD_00154d23_caseD_8;
    case 0x22:
      if (iVar3 != 0x13) {
        *nextTokPtr = (char *)((long)ptr + 1);
        return 0x20;
      }
      goto switchD_00154d23_caseD_8;
    }
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
    iVar3 = 0x13;
    goto LAB_00154cf0;
  case 0x1e:
    iVar3 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    return iVar3;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x17;
    break;
  case 0x20:
    pbVar9 = (byte *)(ptr + 1);
    if (pbVar9 == (byte *)end) {
      return -0x18;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar9);
    if (bVar1 < 0x20) {
      if (2 < bVar1 - 9) {
        if (bVar1 == 0xf) {
          *nextTokPtr = ptr + 2;
          return 0x23;
        }
        if (bVar1 != 0x15) goto switchD_00155230_default;
      }
switchD_00155230_caseD_20:
      *nextTokPtr = (char *)pbVar9;
      iVar3 = 0x18;
    }
    else {
      switch(bVar1) {
      case 0x20:
      case 0x23:
      case 0x24:
        goto switchD_00155230_caseD_20;
      case 0x21:
        *nextTokPtr = ptr + 2;
        iVar3 = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 2;
        iVar3 = 0x25;
        break;
      default:
        goto switchD_00155230_default;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x15;
  }
  return iVar3;
switchD_00154d23_caseD_17:
  ppcVar8 = (char **)((long)ptr + 1);
  if (iVar3 == 0x29) {
    iVar3 = 0x13;
    goto joined_r0x00154cf6;
  }
  if (iVar3 != 0x12) goto joined_r0x00154cf6;
  if (ppcVar8 == (char **)end) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar8);
  iVar3 = 0x13;
  if (bVar1 < 0x16) {
    if (bVar1 == 5) {
      if ((long)end - (long)ppcVar8 < 2) {
        return -2;
      }
      iVar3 = (*enc[2].isPublicId)(enc,(char *)ppcVar8,pcVar6,(char **)puVar5);
      if (iVar3 == 0) goto LAB_00154eb6;
      ppcVar8 = (char **)((long)ptr + 3);
      pcVar6 = extraout_RDX_03;
    }
    else if (bVar1 == 6) {
      if ((long)end - (long)ppcVar8 < 3) {
        return -2;
      }
      iVar3 = (*enc[2].utf8Convert)(enc,ppcVar8,pcVar6,(char **)puVar5,(char *)ppcVar11);
      if (iVar3 == 0) goto LAB_00154eb6;
      ppcVar8 = (char **)((long)ptr + 4);
      pcVar6 = extraout_RDX_04;
    }
    else {
      if (bVar1 != 7) goto joined_r0x00154cf6;
      if ((long)end - (long)ppcVar8 < 4) {
        return -2;
      }
      iVar3 = (*enc[2].utf16Convert)
                        (enc,ppcVar8,pcVar6,(unsigned_short **)puVar5,(unsigned_short *)ppcVar11);
      if (iVar3 == 0) goto LAB_00154eb6;
      ppcVar8 = (char **)((long)ptr + 5);
      pcVar6 = extraout_RDX_02;
    }
LAB_00154e9a:
    iVar3 = 0x29;
    goto joined_r0x00154cf6;
  }
  puVar5 = (uint *)(ulong)(bVar1 - 0x18);
  if ((bVar1 - 0x18 < 4) || (bVar1 == 0x16)) {
    ppcVar8 = (char **)((long)ptr + 2);
    goto LAB_00154e9a;
  }
  if (bVar1 == 0x1d) goto LAB_00154eb6;
  goto joined_r0x00154cf6;
LAB_00154eb6:
  *nextTokPtr = (char *)ppcVar8;
  goto LAB_001552b1;
}

Assistant:

static
int PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                      const char **nextTokPtr)
{
  int tok;
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end)
      return -XML_TOK_PROLOG_S;
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (ptr == end)
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      if (ptr + MINBPC(enc) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        if (ptr == end)
          return XML_TOK_PARTIAL;
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}